

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_value * VmReserveMemObj(jx9_vm *pVm,sxu32 *pIndex)

{
  sxu32 sVar1;
  sxi32 sVar2;
  jx9_value *pjVar3;
  
  if (pIndex != (sxu32 *)0x0) {
    *pIndex = (pVm->aMemObj).nUsed;
  }
  sVar2 = SySetPut(&pVm->aMemObj,"");
  if ((sVar2 == 0) && (sVar1 = (pVm->aMemObj).nUsed, sVar1 != 0)) {
    pjVar3 = (jx9_value *)((ulong)((sVar1 - 1) * (pVm->aMemObj).eSize) + (long)(pVm->aMemObj).pBase)
    ;
  }
  else {
    pjVar3 = (jx9_value *)0x0;
  }
  return pjVar3;
}

Assistant:

static jx9_value * VmReserveMemObj(jx9_vm *pVm, sxu32 *pIndex)
{
	jx9_value *pObj;
	sxi32 rc;
	if( pIndex ){
		/* Object index in the object table */
		*pIndex = SySetUsed(&pVm->aMemObj);
	}
	/* Reserve a slot for the new object */
	rc = SySetPut(&pVm->aMemObj, (const void *)zDummy);
	if( rc != SXRET_OK ){
		/* If the supplied memory subsystem is so sick that we are unable to allocate
		 * a tiny chunk of memory, there is no much we can do here.
		 */
		return 0;
	}
	pObj = (jx9_value *)SySetPeek(&pVm->aMemObj);
	return pObj;
}